

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O2

LispPTR cdr(LispPTR datum)

{
  uint uVar1;
  LispPTR *pLVar2;
  uint LAddr;
  
  do {
    LAddr = datum;
    if (LAddr == 0) {
      return 0;
    }
    if ((*(ushort *)((ulong)(LAddr >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 5) {
      error("cdr : ARG not list");
    }
    pLVar2 = NativeAligned4FromLAddr(LAddr);
    datum = *pLVar2;
    uVar1 = datum >> 0x1c;
    if (uVar1 == 8) {
      return 0;
    }
    if ((int)datum < 0) {
      return LAddr + (uVar1 & 7) * 2;
    }
  } while (datum < 0x10000000);
  pLVar2 = NativeAligned4FromLAddr(LAddr + uVar1 * 2);
  return *pLVar2 & 0xfffffff;
}

Assistant:

LispPTR cdr(LispPTR datum)
/* datum must be LISP pointer(word offset) */
{
  ConsCell *datum68k;
  DLword cdr_code;
  ConsCell *temp;

  if (datum == NIL_PTR) return (NIL_PTR);
  if (!Listp(datum)) error("cdr : ARG not list");

  datum68k = (ConsCell *)(NativeAligned4FromLAddr(datum));
  cdr_code = datum68k->cdr_code;

  if (cdr_code == CDR_NIL) return (NIL_PTR); /* cdr is nil */
  if ((cdr_code & CDR_ONPAGE) != 0) /* cdr-samepage */
#ifdef NEWCDRCODING
    return (datum + ((cdr_code & 7) << 1));
#else
    return (POINTER_PAGEBASE(datum) + ((cdr_code & 127) << 1));
#endif                                 /* NEWCDRCODING */
  if (cdr_code == CDR_INDIRECT) /* cdr_code > CDR_ONPAGE cdr-indirect */
    return (cdr((LispPTR)(datum68k->car_field)));
  /* cdr isn't a CONS, but is stored on this page. */
#ifdef NEWCDRCODING
  temp = (ConsCell *)(NativeAligned4FromLAddr(datum + (cdr_code << 1)));
#else
  temp = (ConsCell *)(NativeAligned4FromLAddr(POINTER_PAGEBASE(datum) + (cdr_code << 1)));
#endif /* NEWCDRCODING */
  return ((LispPTR)temp->car_field);
}